

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

string * __thiscall
pbrt::ShapeSample::ToString_abi_cxx11_(string *__return_storage_ptr__,ShapeSample *this)

{
  float *in_R8;
  
  StringPrintf<pbrt::Interaction_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ ShapeSample intr: %s pdf: %f ]",(char *)this,
             (Interaction *)&this->pdf,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string ShapeSample::ToString() const {
    return StringPrintf("[ ShapeSample intr: %s pdf: %f ]", intr, pdf);
}